

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int luaopen_jit(lua_State *L)

{
  GCtab *in_RDI;
  char *in_stack_00000008;
  lua_State *in_stack_00000010;
  lua_State *in_stack_00000018;
  lua_CFunction *in_stack_00000078;
  uint8_t *in_stack_00000080;
  char *in_stack_00000088;
  lua_State *in_stack_00000090;
  
  jit_init(L);
  lua_pushlstring(in_stack_00000018,(char *)in_stack_00000010,(size_t)in_stack_00000008);
  lua_pushlstring(in_stack_00000018,(char *)in_stack_00000010,(size_t)in_stack_00000008);
  lua_pushinteger(L,(lua_Integer)in_RDI);
  lua_pushlstring(in_stack_00000018,(char *)in_stack_00000010,(size_t)in_stack_00000008);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_prereg(in_stack_00000010,in_stack_00000008,(lua_CFunction)L,in_RDI);
  lj_lib_prereg(in_stack_00000010,in_stack_00000008,(lua_CFunction)L,in_RDI);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  *(long *)&in_RDI->asize = *(long *)&in_RDI->asize + -0x10;
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
#if LJ_HASJIT
  jit_init(L);
#endif
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#if LJ_HASPROFILE
  lj_lib_prereg(L, LUA_JITLIBNAME ".profile", luaopen_jit_profile,
		tabref(L->env));
#endif
#ifndef LUAJIT_DISABLE_JITUTIL
  lj_lib_prereg(L, LUA_JITLIBNAME ".util", luaopen_jit_util, tabref(L->env));
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  return 1;
}